

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int lj_cf_table_concat(lua_State *L)

{
  TValue *pTVar1;
  MSize MVar2;
  GCstr *pGVar3;
  lua_State *in_RDI;
  cTValue *o;
  int32_t e;
  int32_t i;
  MSize seplen;
  GCstr *sep;
  GCtab *t;
  luaL_Buffer b;
  int in_stack_ffffffffffffdf9c;
  undefined4 in_stack_ffffffffffffdfa0;
  int in_stack_ffffffffffffdfa4;
  uint uVar4;
  lua_State *in_stack_ffffffffffffdfa8;
  undefined4 in_stack_ffffffffffffdfb0;
  MSize n;
  undefined4 in_stack_ffffffffffffdfb4;
  MSize MVar5;
  MSize idx;
  TValue *in_stack_ffffffffffffdfb8;
  uint local_2038;
  
  lj_lib_checktab((lua_State *)CONCAT44(in_stack_ffffffffffffdfa4,in_stack_ffffffffffffdfa0),
                  in_stack_ffffffffffffdf9c);
  pGVar3 = lj_lib_optstr((lua_State *)CONCAT44(in_stack_ffffffffffffdfb4,in_stack_ffffffffffffdfb0),
                         (int)((ulong)in_stack_ffffffffffffdfa8 >> 0x20));
  if (pGVar3 == (GCstr *)0x0) {
    MVar5 = 0;
  }
  else {
    MVar5 = pGVar3->len;
  }
  idx = MVar5;
  local_2038 = lj_lib_optint((lua_State *)CONCAT44(MVar5,in_stack_ffffffffffffdfb0),
                             (int)((ulong)in_stack_ffffffffffffdfa8 >> 0x20),
                             (int32_t)in_stack_ffffffffffffdfa8);
  if ((in_RDI->base + 3 < in_RDI->top) && (*(int *)((long)in_RDI->base + 0x1c) != -1)) {
    MVar2 = lj_lib_checkint(in_stack_ffffffffffffdfa8,in_stack_ffffffffffffdfa4);
  }
  else {
    MVar2 = lj_tab_len((GCtab *)in_stack_ffffffffffffdfa8);
  }
  n = MVar2;
  luaL_buffinit(in_RDI,(luaL_Buffer *)&stack0xffffffffffffdfe0);
  if ((int)local_2038 <= (int)MVar2) {
    while( true ) {
      lua_rawgeti((lua_State *)&in_stack_ffffffffffffdfb8->field_2,idx,n);
      pTVar1 = in_RDI->top;
      in_stack_ffffffffffffdfb8 = pTVar1 + -1;
      if ((*(int *)((long)pTVar1 + -4) != -5) && (0xfffeffff < *(uint *)((long)pTVar1 + -4))) {
        if (*(uint *)((long)pTVar1 + -4) < 0xffff0000) {
          uVar4 = 0xd;
        }
        else if (*(int *)((long)pTVar1 + -4) >> 0xf == -2) {
          uVar4 = 3;
        }
        else {
          uVar4 = *(uint *)((long)pTVar1 + -4) ^ 0xffffffff;
        }
        lj_err_callerv(in_RDI,LJ_ERR_TABCAT,lj_obj_itypename[uVar4],(ulong)local_2038);
      }
      luaL_addvalue((luaL_Buffer *)CONCAT44(idx,n));
      uVar4 = local_2038 + 1;
      if (local_2038 == MVar2) break;
      local_2038 = uVar4;
      if (MVar5 != 0) {
        luaL_addlstring((luaL_Buffer *)CONCAT44(idx,n),(char *)in_stack_ffffffffffffdfa8,
                        CONCAT44(in_stack_ffffffffffffdfa4,in_stack_ffffffffffffdfa0));
      }
    }
  }
  luaL_pushresult((luaL_Buffer *)0x18a98a);
  return 1;
}

Assistant:

LJLIB_CF(table_concat)
{
  luaL_Buffer b;
  GCtab *t = lj_lib_checktab(L, 1);
  GCstr *sep = lj_lib_optstr(L, 2);
  MSize seplen = sep ? sep->len : 0;
  int32_t i = lj_lib_optint(L, 3, 1);
  int32_t e = (L->base+3 < L->top && !tvisnil(L->base+3)) ?
	      lj_lib_checkint(L, 4) : (int32_t)lj_tab_len(t);
  luaL_buffinit(L, &b);
  if (i <= e) {
    for (;;) {
      cTValue *o;
      lua_rawgeti(L, 1, i);
      o = L->top-1;
      if (!(tvisstr(o) || tvisnumber(o)))
	lj_err_callerv(L, LJ_ERR_TABCAT, lj_typename(o), i);
      luaL_addvalue(&b);
      if (i++ == e) break;
      if (seplen)
	luaL_addlstring(&b, strdata(sep), seplen);
    }
  }
  luaL_pushresult(&b);
  return 1;
}